

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

double duckdb::TryCastCInternal<float,double,duckdb::TryCast>
                 (duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  double result_value;
  double *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  undefined8 local_28;
  undefined8 local_8;
  
  UnsafeFetch<float>((duckdb_result *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     (idx_t)in_stack_ffffffffffffffb8,0x1947747);
  bVar1 = TryCast::Operation<float,double>
                    (in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8,false);
  if (bVar1) {
    local_8 = local_28;
  }
  else {
    local_8 = FetchDefaultValue::Operation<double>();
  }
  return local_8;
}

Assistant:

RESULT_TYPE TryCastCInternal(duckdb_result *result, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!OP::template Operation<SOURCE_TYPE, RESULT_TYPE>(UnsafeFetch<SOURCE_TYPE>(result, col, row),
		                                                      result_value)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}